

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResamplerModel.cpp
# Opt level: O0

FloatSampleProvider *
SRCTools::ResamplerModel::createResamplerModel(FloatSampleProvider *source,ResamplerStage *stage)

{
  CascadeStage *this;
  ResamplerStage *stage_local;
  FloatSampleProvider *source_local;
  
  this = (CascadeStage *)operator_new(0x8028);
  CascadeStage::CascadeStage(this,source,stage);
  return &this->super_FloatSampleProvider;
}

Assistant:

FloatSampleProvider &ResamplerModel::createResamplerModel(FloatSampleProvider &source, ResamplerStage &stage) {
	return *new CascadeStage(source, stage);
}